

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O0

char * GetLogString(LogMsgTy *l)

{
  undefined4 uVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  long in_RDI;
  size_t sl;
  string netwT;
  lock_guard<std::recursive_mutex> lock;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  lock_guard<std::recursive_mutex> *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffffb8;
  float runS;
  string local_30 [40];
  long local_8;
  
  runS = (float)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_8 = in_RDI;
  std::lock_guard<std::recursive_mutex>::lock_guard
            (in_stack_ffffffffffffff70,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  NetwTimeString_abi_cxx11_(runS);
  if (*(int *)(local_8 + 0x60) < 5) {
    uVar3 = std::__cxx11::string::c_str();
    pcVar2 = LOG_LEVEL[*(uint *)(local_8 + 0x60)];
    uVar4 = std::__cxx11::string::c_str();
    uVar1 = *(undefined4 *)(local_8 + 0x38);
    uVar5 = std::__cxx11::string::c_str();
    uVar6 = std::__cxx11::string::c_str();
    snprintf(gBuf,0xfcf,"%s LiveTraffic %s %s:%d/%s: %s",uVar3,pcVar2,uVar4,uVar1,uVar5,uVar6);
  }
  else {
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    snprintf(gBuf,0xfcf,"%s LiveTraffic: %s",uVar3,uVar4);
  }
  sVar7 = strlen(gBuf);
  if (*(char *)((long)&gLogCnt + sVar7 + 7) != '\n') {
    gBuf[sVar7] = '\n';
    gBuf[sVar7 + 1] = '\0';
  }
  std::__cxx11::string::~string(local_30);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x27d24d);
  return gBuf;
}

Assistant:

const char* GetLogString (const LogMsgTy& l)
{
    // Access to static buffer and list guarded by a lock
    std::lock_guard<std::recursive_mutex> lock(gLogMutex);
    
    // Network time string
    const std::string netwT = NetwTimeString(l.netwTime);

    // prepare timestamp
    if (l.lvl < logMSG)                             // normal messages without, all other with location info
    {
        snprintf(gBuf, sizeof(gBuf)-1, "%s " LIVE_TRAFFIC " %s %s:%d/%s: %s",
                 netwT.c_str(),                     // network time (string)
                 LOG_LEVEL[l.lvl],                  // logging level
                 l.fileName.c_str(), l.ln,          // source file and line number
                 l.func.c_str(),                    // function name
                 l.msg.c_str());                    // actual message
    }
    else
        snprintf(gBuf, sizeof(gBuf)-1, "%s " LIVE_TRAFFIC ": %s",
                 netwT.c_str(),                     // network time (string)
                 l.msg.c_str());                    // actual message
    
    // ensure there's a trailing CR
    size_t sl = strlen(gBuf);
    if (gBuf[sl-1] != '\n')
    {
        gBuf[sl]   = '\n';
        gBuf[sl+1] = 0;
    }

    // return the static buffer
    return gBuf;
}